

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
pstack::Reader::readObj<Elf64_Vernaux>
          (Reader *this,Off offset,anon_struct_16_5_66934d0a *object,size_t count)

{
  ostringstream *poVar1;
  int iVar2;
  undefined4 extraout_var;
  Exception *this_00;
  Exception local_1d0;
  
  if (count != 0) {
    iVar2 = (*this->_vptr_Reader[2])(this,offset,count << 4,object);
    if (CONCAT44(extraout_var,iVar2) != count << 4) {
      this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset(&local_1d0,0,0x1a0);
      Exception::Exception(&local_1d0);
      poVar1 = &local_1d0.str;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"incomplete object read from ",0x1c);
      (*this->_vptr_Reader[5])(this,poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," at offset ",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," for ",5);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," bytes",6);
      Exception::Exception(this_00,&local_1d0);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return;
}

Assistant:

void
Reader::readObj(Off offset, Obj *object, size_t count) const
{
    if (count == 0)
        return;
    size_t rc = read(offset, count * sizeof *object, (char *)object);
    if (rc != count * sizeof *object)
        throw Exception() << "incomplete object read from " << *this
           << " at offset " << offset
           << " for " << count << " bytes";
}